

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O1

int histo_minmax_expr_workfn
              (long totalrows,long offset,long firstrow,long nrows,int nCols,iteratorCol *colData,
              void *userPtr)

{
  double dVar1;
  double dVar2;
  void *userPtr_00;
  double *pdVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  userPtr_00 = *userPtr;
  iVar4 = fits_parser_workfn(totalrows,offset,firstrow,nrows,nCols,colData,userPtr_00);
  lVar5 = nrows * *(long *)((long)userPtr_00 + 0x50);
  if (0 < lVar5) {
    pdVar3 = (double *)colData[(long)nCols + -1].array;
    dVar1 = **(double **)(*userPtr + 0x10);
    lVar6 = 0;
    do {
      if ((*pdVar3 != 0.0) || (NAN(*pdVar3))) {
        if ((pdVar3[lVar6 + 1] != dVar1) || (NAN(pdVar3[lVar6 + 1]) || NAN(dVar1)))
        goto LAB_001c5100;
      }
      else {
LAB_001c5100:
        dVar2 = *(double *)((long)userPtr + 8);
        if ((pdVar3[lVar6 + 1] < dVar2) || ((dVar2 == -9.1191291391491e-36 && (!NAN(dVar2))))) {
          *(double *)((long)userPtr + 8) = pdVar3[lVar6 + 1];
        }
        dVar2 = *(double *)((long)userPtr + 0x10);
        if ((dVar2 < pdVar3[lVar6 + 1]) || ((dVar2 == -9.1191291391491e-36 && (!NAN(dVar2))))) {
          *(double *)((long)userPtr + 0x10) = pdVar3[lVar6 + 1];
        }
        *(long *)((long)userPtr + 0x20) = *(long *)((long)userPtr + 0x20) + 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 - lVar6 != 0);
    *(long *)((long)userPtr + 0x18) = *(long *)((long)userPtr + 0x18) + lVar5;
  }
  return iVar4;
}

Assistant:

static int histo_minmax_expr_workfn( long    totalrows,     /* I - Total rows to be processed     */
                long    offset,        /* I - Number of rows skipped at start*/
                long    firstrow,      /* I - First row of this iteration    */
                long    nrows,         /* I - Number of rows in this iter    */
                int      nCols,        /* I - Number of columns in use       */
                iteratorCol *colData,  /* IO- Column information/data        */
                void    *userPtr )     /* I - Data handling instructions     */
/*                                                                           */
/* Iterator work function which evaluates a parser result and computes       */
/* min max value */
/*---------------------------------------------------------------------------*/
{
  int status = 0;
  long i;
  double *data;
  double nulval;
  struct histo_minmax_workfn_struct *wf = ((struct histo_minmax_workfn_struct *)userPtr);
  struct ParseStatusVariables *pv = &(wf->Info->parseVariables);
  iteratorCol *outcol = &(colData[nCols-1]);

  /* Call calculator work function.  Result is put in final column of colData as a TemporaryCol */
  status = fits_parser_workfn(totalrows, offset, firstrow, nrows, 
			      nCols, colData, (void *) wf->Info);

  /* The result of the calculation is in pv->Data, and null value in pv->Null */
  data = (double *)(outcol->array);
  nulval = *((double *)(wf->Info->nullPtr));

  for (i = 1; i<=(nrows*pv->repeat); i++ ) {
    /* Note that data[0] == 0 indicates no null values at all!!! */
    if (data[0] == 0 || data[i] != nulval) {
      if (data[i] < wf->datamin || wf->datamin == DOUBLENULLVALUE) wf->datamin = data[i];
      if (data[i] > wf->datamax || wf->datamax == DOUBLENULLVALUE) wf->datamax = data[i];
      wf->ngood ++;
    }
     wf->ntotal ++;
  }

  return status;
}